

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cc
# Opt level: O3

uint64_t kratos::eval_bin_op(uint64_t left_value,uint64_t right_value,ExprOp op,uint32_t width,
                            bool signed_)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  runtime_error *this;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  uint64_t uVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  bVar2 = (byte)width;
  bVar4 = bVar2 - 1;
  bVar10 = left_value >> (bVar4 & 0x3f) != 0;
  bVar8 = bVar10 && signed_;
  bVar11 = right_value >> (bVar4 & 0x3f) != 0;
  bVar9 = bVar11 && signed_;
  uVar7 = left_value;
  if (bVar10 && signed_) {
    uVar7 = (-(-1L << (bVar2 & 0x3f) ^ left_value) << (-bVar2 & 0x3f)) >> (-bVar2 & 0x3f);
  }
  if (bVar11 && signed_) {
    uVar5 = 0xffffffffffffffff >> (-bVar2 & 0x3f);
    uVar6 = -(-1L << (bVar2 & 0x3f) ^ right_value) & uVar5;
  }
  else {
    uVar5 = 0xffffffffffffffff >> (-bVar2 & 0x3f);
    uVar6 = right_value;
  }
  if (0x12 < op - Add) {
switchD_001fae9a_caseD_b:
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Not implemented");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = (byte)right_value;
  switch(op) {
  case Add:
    uVar3 = right_value + left_value;
    break;
  case Minus:
    uVar3 = left_value - right_value & uVar5;
    break;
  case Divide:
    uVar3 = uVar7 / uVar6;
    if (signed_ && bVar10 != bVar11) {
      uVar3 = -(uVar3 ^ -1L << (bVar2 & 0x3f)) & uVar5;
    }
    break;
  case Multiply:
    uVar3 = uVar6 * uVar7;
    if (signed_ && bVar10 != bVar11) {
      uVar3 = -(uVar3 ^ -1L << (bVar2 & 0x3f)) & uVar5;
    }
    break;
  default:
    goto switchD_001fae9a_caseD_b;
  case LogicalShiftRight:
    uVar3 = left_value >> (bVar1 & 0x3f);
    break;
  case SignedShiftRight:
    uVar3 = uVar7 >> (bVar1 & 0x3f);
    if (bVar10 && signed_) {
      uVar3 = uVar3 | -1L << (bVar4 - bVar1 & 0x3f);
    }
    break;
  case Or:
    uVar3 = right_value | left_value;
    break;
  case And:
    uVar3 = right_value & left_value;
    break;
  case Xor:
    uVar3 = right_value ^ left_value;
    break;
  case Power:
    auVar13._8_4_ = (int)(left_value >> 0x20);
    auVar13._0_8_ = left_value;
    auVar13._12_4_ = 0x45300000;
    auVar14._8_4_ = (int)(right_value >> 0x20);
    auVar14._0_8_ = right_value;
    auVar14._12_4_ = 0x45300000;
    dVar12 = pow((auVar13._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)left_value) - 4503599627370496.0),
                 (auVar14._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)right_value) - 4503599627370496.0));
    uVar3 = (long)(dVar12 - 9.223372036854776e+18) & (long)dVar12 >> 0x3f | (long)dVar12;
    break;
  case LessThan:
    uVar3 = 1;
    if (!(bool)(~bVar8 & 1) && (!bVar11 || !signed_)) break;
    if (!(bool)(~bVar9 & 1) && (!bVar10 || !signed_)) goto LAB_001fafce;
    bVar9 = uVar7 < uVar6;
    goto LAB_001fafc2;
  case GreaterThan:
    if (!(bool)(~bVar8 & 1) && (!bVar11 || !signed_)) {
LAB_001fafce:
      uVar3 = 0;
      break;
    }
    uVar3 = 1;
    if (!(bool)(~bVar9 & 1) && (!bVar10 || !signed_)) break;
    bVar9 = uVar6 < uVar7;
    goto LAB_001fafc2;
  case LessEqThan:
    uVar3 = 1;
    if (!(bool)(~bVar8 & 1) && (!bVar11 || !signed_)) break;
    if (!(bool)(~bVar9 & 1) && (!bVar10 || !signed_)) goto LAB_001fafce;
    bVar9 = uVar7 <= uVar6;
    goto LAB_001fafc2;
  case GreaterEqThan:
    if (!(bool)(~bVar8 & 1) && (!bVar11 || !signed_)) goto LAB_001fafce;
    uVar3 = 1;
    if (!(bool)(~bVar9 & 1) && (!bVar10 || !signed_)) break;
    bVar9 = uVar6 <= uVar7;
LAB_001fafc2:
    uVar3 = (ulong)(byte)(bVar8 ^ bVar9);
    break;
  case Eq:
    uVar3 = (ulong)(left_value == right_value);
  }
  return uVar3 & uVar5;
}

Assistant:

uint64_t eval_bin_op(uint64_t left_value, uint64_t right_value, ExprOp op, uint32_t width,
                     bool signed_) {
    bool left_negative = signed_ && left_value >> (width - 1);
    bool right_negative = signed_ && right_value >> (width - 1);
    uint64_t left_abs_value = left_negative ? two_complement(left_value, width) : left_value;
    uint64_t right_abs_value = right_negative ? two_complement(right_value, width) : right_value;
    uint64_t signed_bit = static_cast<uint64_t>(left_negative ^ right_negative) << (width - 1);
    auto const mask = UINT64_MASK >> (64u - width);
    uint64_t result;
    switch (op) {
        case ExprOp::Add:
            result = left_value + right_value;
            break;
        case ExprOp::Minus:
            result = (left_value - right_value) & mask;
            break;
        case ExprOp::Multiply:
            result = left_abs_value * right_abs_value;
            if (signed_bit) result = two_complement(result, width);
            break;
        case ExprOp::Divide:
            result = left_abs_value / right_abs_value;
            if (signed_bit) result = two_complement(result, width);
            break;
        case ExprOp::And:
            result = left_value & right_value;
            break;
        case ExprOp::Or:
            result = left_value | right_value;
            break;
        case ExprOp::Xor:
            result = left_value ^ right_value;
            break;
        case ExprOp::Eq:
            result = left_value == right_value;
            break;
        case ExprOp::Power:
            result = static_cast<uint64_t>(std::pow(left_value, right_value));
            break;
        case ExprOp::GreaterEqThan:
            result = left_abs_value >= right_abs_value;
            result = (left_negative && !right_negative)
                         ? false
                         : !left_negative && right_negative ? true : result ^ left_negative;
            break;
        case ExprOp::LessEqThan:
            result = left_abs_value <= right_abs_value;
            result = (left_negative && !right_negative)
                         ? true
                         : !left_negative && right_negative ? false : result ^ left_negative;
            break;
        case ExprOp::LessThan:
            result = left_abs_value < right_abs_value;
            result = (left_negative && !right_negative)
                         ? true
                         : !left_negative && right_negative ? false : result ^ left_negative;
            break;
        case ExprOp ::GreaterThan:
            result = left_abs_value > right_abs_value;
            result = (left_negative && !right_negative)
                         ? false
                         : !left_negative && right_negative ? true : result ^ left_negative;
            break;
        case ExprOp::SignedShiftRight:
            result = left_abs_value >> right_value;
            if (left_negative) result |= UINT64_MASK << (width - 1 - right_value);
            break;
        case ExprOp::LogicalShiftRight:
            result = left_value >> right_value;
            break;
        default: {
            throw std::runtime_error("Not implemented");
        }
    }
    result = result & (UINT64_MASK >> (64 - width));
    return result;
}